

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdockwidget.cpp
# Opt level: O3

void QDockWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *title;
  DockWidgetArea *pDVar1;
  code *pcVar2;
  long lVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  DockWidgetArea DVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined4 local_3c;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_3c = *_a[1];
      iVar8 = 0;
      break;
    case 1:
      local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
      iVar8 = 1;
      break;
    case 2:
      local_3c = *_a[1];
      iVar8 = 2;
      break;
    case 3:
      local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
      iVar8 = 3;
      break;
    case 4:
      local_3c = *_a[1];
      iVar8 = 4;
      break;
    default:
      goto switchD_0040287b_caseD_3;
    }
    local_38.d.ptr = (char16_t *)&local_3c;
    local_38.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar8,(void **)&local_38);
    break;
  case ReadProperty:
    if (4 < (uint)_id) break;
    pDVar1 = (DockWidgetArea *)*_a;
    switch(_id) {
    case 0:
      *(undefined1 *)pDVar1 = *(byte *)(*(long *)(_o + 0x20) + 0xc) & LeftDockWidgetArea;
      goto switchD_0040287b_caseD_3;
    case 1:
      DVar7 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x260);
      break;
    case 2:
      DVar7 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x264);
      break;
    case 3:
      QWidget::windowTitle(&local_38,(QWidget *)_o);
      pQVar4 = *(QArrayData **)pDVar1;
      *(Data **)pDVar1 = local_38.d.d;
      pcVar5 = *(char16_t **)(pDVar1 + 2);
      *(char16_t **)(pDVar1 + 2) = local_38.d.ptr;
      uVar6 = *(undefined8 *)(pDVar1 + 4);
      *(qsizetype *)(pDVar1 + 4) = local_38.d.size;
      local_38.d.d = (Data *)pQVar4;
      local_38.d.ptr = pcVar5;
      local_38.d.size = uVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      goto switchD_0040287b_caseD_3;
    case 4:
      DVar7 = dockLocation((QDockWidget *)_o);
    }
    *pDVar1 = DVar7;
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      title = (QString *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QDockWidgetPrivate::setFloating(*(QDockWidgetPrivate **)(_o + 8),*(bool *)&(title->d).d);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFeatures((QDockWidget *)_o,
                      (QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                      *(QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> *)&(title->d).d);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAllowedAreas((QDockWidget *)_o,
                          (QFlagsStorageHelper<Qt::DockWidgetArea,_4>)
                          *(QFlagsStorageHelper<Qt::DockWidgetArea,_4> *)&(title->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWidget::setWindowTitle((QWidget *)_o,title);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDockLocation((QDockWidget *)_o,*(DockWidgetArea *)&(title->d).d);
          return;
        }
      }
      goto LAB_00402bcc;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == featuresChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == topLevelChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == allowedAreasChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == visibilityChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == dockLocationChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
  }
switchD_0040287b_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00402bcc:
  __stack_chk_fail();
}

Assistant:

void QDockWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->featuresChanged((*reinterpret_cast< std::add_pointer_t<QDockWidget::DockWidgetFeatures>>(_a[1]))); break;
        case 1: _t->topLevelChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->allowedAreasChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetAreas>>(_a[1]))); break;
        case 3: _t->visibilityChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->dockLocationChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetArea>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(QDockWidget::DockWidgetFeatures )>(_a, &QDockWidget::featuresChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::topLevelChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetAreas )>(_a, &QDockWidget::allowedAreasChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::visibilityChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetArea )>(_a, &QDockWidget::dockLocationChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isFloating(); break;
        case 1: QtMocHelpers::assignFlags<DockWidgetFeatures>(_v, _t->features()); break;
        case 2: *reinterpret_cast<Qt::DockWidgetAreas*>(_v) = _t->allowedAreas(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 4: *reinterpret_cast<Qt::DockWidgetArea*>(_v) = _t->dockLocation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFloating(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFeatures(*reinterpret_cast<DockWidgetFeatures*>(_v)); break;
        case 2: _t->setAllowedAreas(*reinterpret_cast<Qt::DockWidgetAreas*>(_v)); break;
        case 3: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setDockLocation(*reinterpret_cast<Qt::DockWidgetArea*>(_v)); break;
        default: break;
        }
    }
}